

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O0

bool __thiscall fasttext::Autotune::quantize(Autotune *this,Args *args,Args *autotuneArgs)

{
  int iVar1;
  int64_t iVar2;
  ostream *this_00;
  void *this_01;
  long in_RDX;
  long in_RSI;
  int64_t outputSize;
  Args *in_stack_000000e8;
  FastText *in_stack_000000f0;
  Args *in_stack_00000108;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  FastText *in_stack_ffffffffffffffc8;
  bool local_1;
  
  iVar2 = Args::getAutotuneModelSize(in_stack_00000108);
  if (((double)iVar2 != -1.0) || (NAN((double)iVar2))) {
    std::__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1787c0);
    FastText::getOutputMatrix(in_stack_ffffffffffffffc8);
    std::__shared_ptr_access<const_fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1787dc);
    iVar2 = Matrix::size((Matrix *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    std::shared_ptr<const_fasttext::DenseMatrix>::~shared_ptr
              ((shared_ptr<const_fasttext::DenseMatrix> *)0x1787f9);
    *(undefined1 *)(in_RSI + 0x112) = 1;
    *(bool *)(in_RSI + 0x110) = 0xff < iVar2;
    *(undefined1 *)(in_RSI + 0x111) = 1;
    Args::getAutotuneModelSize(in_stack_00000108);
    iVar1 = getCutoffForFileSize
                      ((Autotune *)args,autotuneArgs._7_1_,autotuneArgs._6_1_,(int)autotuneArgs,
                       outputSize);
    *(long *)(in_RSI + 0x118) = (long)iVar1;
    if (2 < *(int *)(in_RDX + 0xe0)) {
      this_00 = std::operator<<((ostream *)&std::cout,"cutoff = ");
      this_01 = (void *)std::ostream::operator<<(this_00,*(ulong *)(in_RSI + 0x118));
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    }
    if (*(long *)(in_RSI + 0x118) == 0x100) {
      local_1 = false;
    }
    else {
      std::__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x178923);
      FastText::quantize(in_stack_000000f0,in_stack_000000e8);
      local_1 = true;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Autotune::quantize(Args& args, const Args& autotuneArgs) {
  if (autotuneArgs.getAutotuneModelSize() == Args::kUnlimitedModelSize) {
    return true;
  }
  auto outputSize = fastText_->getOutputMatrix()->size(0);

  args.qnorm = true;
  args.qout = (outputSize >= kCutoffLimit);
  args.retrain = true;
  args.cutoff = getCutoffForFileSize(
      args.qout, args.qnorm, args.dsub, autotuneArgs.getAutotuneModelSize());
  LOG_VAL(cutoff, args.cutoff);
  if (args.cutoff == kCutoffLimit) {
    return false;
  }
  fastText_->quantize(args);

  return true;
}